

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCacheManager.cxx
# Opt level: O0

char * __thiscall cmCacheManager::GetInitializedCacheValue(cmCacheManager *this,string *key)

{
  bool bVar1;
  pointer ppVar2;
  byte local_31;
  _Self local_30;
  _Self local_28;
  const_iterator i;
  string *key_local;
  cmCacheManager *this_local;
  
  i._M_node = (_Base_ptr)key;
  local_28._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCacheManager::CacheEntry,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCacheManager::CacheEntry>_>_>
       ::find(&this->Cache,key);
  local_30._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCacheManager::CacheEntry,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCacheManager::CacheEntry>_>_>
       ::end(&this->Cache);
  bVar1 = std::operator!=(&local_28,&local_30);
  local_31 = 0;
  if (bVar1) {
    ppVar2 = std::
             _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCacheManager::CacheEntry>_>
             ::operator->(&local_28);
    local_31 = (ppVar2->second).Initialized;
  }
  if ((local_31 & 1) == 0) {
    this_local = (cmCacheManager *)0x0;
  }
  else {
    std::
    _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCacheManager::CacheEntry>_>
    ::operator->(&local_28);
    this_local = (cmCacheManager *)std::__cxx11::string::c_str();
  }
  return (char *)this_local;
}

Assistant:

const char*
cmCacheManager::GetInitializedCacheValue(const std::string& key) const
{
  CacheEntryMap::const_iterator i = this->Cache.find(key);
  if(i != this->Cache.end() &&
    i->second.Initialized)
    {
    return i->second.Value.c_str();
    }
  return 0;
}